

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int attach_set_unsettled(ATTACH_HANDLE attach,AMQP_VALUE unsettled_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x1241;
  }
  else {
    if (unsettled_value == (AMQP_VALUE)0x0) {
      item_value = (AMQP_VALUE)0x0;
    }
    else {
      item_value = amqpvalue_clone(unsettled_value);
    }
    if (item_value == (AMQP_VALUE)0x0) {
      iVar2 = 0x1251;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,7,item_value);
      iVar2 = 0x1257;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return iVar2;
}

Assistant:

int attach_set_unsettled(ATTACH_HANDLE attach, AMQP_VALUE unsettled_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE unsettled_amqp_value;
        if (unsettled_value == NULL)
        {
            unsettled_amqp_value = NULL;
        }
        else
        {
            unsettled_amqp_value = amqpvalue_clone(unsettled_value);
        }
        if (unsettled_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 7, unsettled_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(unsettled_amqp_value);
        }
    }

    return result;
}